

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O1

KeyboardMapping * Tunings::readKBMStream(KeyboardMapping *__return_storage_ptr__,istream *inf)

{
  byte bVar1;
  pointer piVar2;
  iterator __position;
  bool bVar3;
  double dVar4;
  int iVar5;
  istream *piVar6;
  ostream *poVar7;
  _Alloc_hider _Var8;
  TuningError *pTVar9;
  long *plVar10;
  uint uVar11;
  size_type *psVar12;
  int iVar13;
  long lVar14;
  char __rhs;
  int __val;
  char *pcVar15;
  string line;
  int i;
  ostringstream rawOSS;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  vector<int,std::allocator<int>> *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [11];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_local_buf[0] = '\0';
  KeyboardMapping::KeyboardMapping(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  piVar2 = (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  local_448 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->keys;
  __val = 0;
  uVar11 = 0;
  do {
    do {
      piVar6 = getlineEndingIndependent(inf,&local_4a8);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
        if (1 < uVar11 - 7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"Incomplete KBM stream. Only able to read ",0x29);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_320,__val);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," lines. Read up to ",0x13);
          if (uVar11 < 7) {
            pcVar15 = &DAT_00105550 + *(int *)(&DAT_00105550 + (ulong)uVar11 * 4);
            lVar14 = *(long *)(&DAT_00105570 + (ulong)uVar11 * 8);
          }
          else {
            lVar14 = 0xd;
            pcVar15 = "unknown state";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar15,lVar14);
          pTVar9 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          TuningError::TuningError(pTVar9,&local_3a0);
          __cxa_throw(pTVar9,&TuningError::typeinfo,TuningError::~TuningError);
        }
        if (__return_storage_ptr__->count !=
            (int)((ulong)((long)(__return_storage_ptr__->keys).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->keys).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
          pTVar9 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_468,__return_storage_ptr__->count);
          std::operator+(&local_420,
                         "Different number of keys than mapping file indicates. Count is ",
                         &local_468);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
          local_488._M_dataplus._M_p = (pointer)*plVar10;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((size_type *)local_488._M_dataplus._M_p == psVar12) {
            local_488.field_2._M_allocated_capacity = *psVar12;
            local_488.field_2._8_8_ = plVar10[3];
            local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
          }
          else {
            local_488.field_2._M_allocated_capacity = *psVar12;
          }
          local_488._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::to_string
                    (&local_440,
                     (long)(__return_storage_ptr__->keys).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->keys).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
          std::operator+(local_320,&local_488,&local_440);
          plVar10 = (long *)std::__cxx11::string::append((char *)local_320);
          local_3e0._M_dataplus._M_p = (pointer)*plVar10;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((size_type *)local_3e0._M_dataplus._M_p == psVar12) {
            local_3e0.field_2._M_allocated_capacity = *psVar12;
            local_3e0.field_2._8_8_ = plVar10[3];
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          }
          else {
            local_3e0.field_2._M_allocated_capacity = *psVar12;
          }
          local_3e0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          TuningError::TuningError(pTVar9,&local_3e0);
          __cxa_throw(pTVar9,&TuningError::typeinfo,TuningError::~TuningError);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->rawText,(string *)local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_320[0]._M_dataplus._M_p._4_4_,(int)local_320[0]._M_dataplus._M_p) !=
            &local_320[0].field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_320[0]._M_dataplus._M_p._4_4_,
                                   (int)local_320[0]._M_dataplus._M_p),
                          local_320[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,
                          CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                                   local_4a8.field_2._M_local_buf[0]) + 1);
        }
        return __return_storage_ptr__;
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_4a8._M_dataplus._M_p,local_4a8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      __val = __val + 1;
    } while (*local_4a8._M_dataplus._M_p == 0x21);
    iVar5 = std::__cxx11::string::compare((char *)&local_4a8);
    if (iVar5 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_4a8,0,(char *)local_4a8._M_string_length,0x10520f);
    }
    else if (uVar11 != 8) {
      if ((char *)local_4a8._M_string_length == (char *)0x0) {
        __rhs = '\0';
LAB_00102d47:
        pTVar9 = (TuningError *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_360,__val);
        std::operator+(&local_340,"Invalid line ",&local_360);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_3c0._M_dataplus._M_p = (pointer)*plVar10;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_3c0._M_dataplus._M_p == psVar12) {
          local_3c0.field_2._M_allocated_capacity = *psVar12;
          local_3c0.field_2._8_8_ = plVar10[3];
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        }
        else {
          local_3c0.field_2._M_allocated_capacity = *psVar12;
        }
        local_3c0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::operator+(&local_440,&local_3c0,&local_4a8);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_440);
        local_468._M_dataplus._M_p = (pointer)*plVar10;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_468._M_dataplus._M_p == psVar12) {
          local_468.field_2._M_allocated_capacity = *psVar12;
          local_468.field_2._8_8_ = plVar10[3];
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        }
        else {
          local_468.field_2._M_allocated_capacity = *psVar12;
        }
        local_468._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::operator+(&local_420,&local_468,__rhs);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
        local_488._M_dataplus._M_p = (pointer)*plVar10;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_488._M_dataplus._M_p == psVar12) {
          local_488.field_2._M_allocated_capacity = *psVar12;
          local_488.field_2._8_8_ = plVar10[3];
          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        }
        else {
          local_488.field_2._M_allocated_capacity = *psVar12;
        }
        local_488._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::to_string(&local_380,(int)__rhs);
        std::operator+(local_320,&local_488,&local_380);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_320);
        local_400._M_dataplus._M_p = (pointer)*plVar10;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_400._M_dataplus._M_p == psVar12) {
          local_400.field_2._M_allocated_capacity = *psVar12;
          local_400.field_2._8_8_ = plVar10[3];
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
        }
        else {
          local_400.field_2._M_allocated_capacity = *psVar12;
        }
        local_400._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        TuningError::TuningError(pTVar9,&local_400);
        __cxa_throw(pTVar9,&TuningError::typeinfo,TuningError::~TuningError);
      }
      bVar3 = (char *)local_4a8._M_string_length != (char *)0x0;
      iVar5 = 0;
      _Var8._M_p = local_4a8._M_dataplus._M_p;
      do {
        bVar1 = *_Var8._M_p;
        iVar13 = (int)(char)bVar1;
        if (iVar13 != 0x20) {
          if (bVar1 == 0) break;
          if ((9 < iVar13 - 0x30U) &&
             ((0x2e < bVar1 || ((0x400000002400U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
            bVar3 = false;
            iVar5 = iVar13;
          }
        }
        __rhs = (char)iVar5;
        _Var8._M_p = _Var8._M_p + 1;
        if (!bVar3) goto LAB_00102d47;
      } while( true );
    }
    _Var8._M_p = local_4a8._M_dataplus._M_p;
    local_320[0]._M_dataplus._M_p._0_4_ = atoi(local_4a8._M_dataplus._M_p);
    dVar4 = locale_atof(_Var8._M_p);
    switch(uVar11) {
    case 0:
      __return_storage_ptr__->count = (int)local_320[0]._M_dataplus._M_p;
      uVar11 = 0;
      break;
    case 1:
      __return_storage_ptr__->firstMidi = (int)local_320[0]._M_dataplus._M_p;
      uVar11 = 1;
      break;
    case 2:
      __return_storage_ptr__->lastMidi = (int)local_320[0]._M_dataplus._M_p;
      uVar11 = 2;
      break;
    case 3:
      __return_storage_ptr__->middleNote = (int)local_320[0]._M_dataplus._M_p;
      uVar11 = 3;
      break;
    case 4:
      __return_storage_ptr__->tuningConstantNote = (int)local_320[0]._M_dataplus._M_p;
      uVar11 = 4;
      break;
    case 5:
      __return_storage_ptr__->tuningFrequency = dVar4;
      __return_storage_ptr__->tuningPitch = dVar4 / 8.17579891564371;
      uVar11 = 5;
      break;
    case 6:
      __return_storage_ptr__->octaveDegrees = (int)local_320[0]._M_dataplus._M_p;
      uVar11 = 6;
      break;
    case 7:
      __position._M_current =
           (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_448,__position,(int *)local_320);
      }
      else {
        *__position._M_current = (int)local_320[0]._M_dataplus._M_p;
        (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar11 = (__return_storage_ptr__->count ==
               (int)((ulong)((long)(__return_storage_ptr__->keys).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->keys).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2)) + 7;
    }
    uVar11 = uVar11 + (uVar11 - 9 < 0xfffffffe);
    if (uVar11 == 7 && __return_storage_ptr__->count == 0) {
      uVar11 = 8;
    }
  } while( true );
}

Assistant:

inline KeyboardMapping readKBMStream(std::istream &inf)
{
    std::string line;

    KeyboardMapping res;
    std::ostringstream rawOSS;
    res.keys.clear();

    enum parsePosition
    {
        map_size = 0,
        first_midi,
        last_midi,
        middle,
        reference,
        freq,
        degree,
        keys,
        trailing
    };
    parsePosition state = map_size;

    int lineno = 0;
    while (getlineEndingIndependent(inf, line))
    {
        rawOSS << line << "\n";
        lineno++;
        if (line[0] == '!')
        {
            continue;
        }

        if (line == "x")
            line = "-1";
        else if (state != trailing)
        {
            const char *lc = line.c_str();
            bool validLine = line.length() > 0;
            char badChar = '\0';
            while (validLine && *lc != '\0')
            {
                if (!(*lc == ' ' || std::isdigit(*lc) || *lc == '.' || *lc == (char)13 ||
                      *lc == '\n'))
                {
                    validLine = false;
                    badChar = *lc;
                }
                lc++;
            }
            if (!validLine)
            {
                throw TuningError("Invalid line " + std::to_string(lineno) + ". line='" + line +
                                  "'. Bad character is '" + badChar + "/" +
                                  std::to_string((int)badChar) + "'");
            }
        }

        int i = std::atoi(line.c_str());
        double v = locale_atof(line.c_str());

        switch (state)
        {
        case map_size:
            res.count = i;
            break;
        case first_midi:
            res.firstMidi = i;
            break;
        case last_midi:
            res.lastMidi = i;
            break;
        case middle:
            res.middleNote = i;
            break;
        case reference:
            res.tuningConstantNote = i;
            break;
        case freq:
            res.tuningFrequency = v;
            res.tuningPitch = res.tuningFrequency / 8.17579891564371;
            break;
        case degree:
            res.octaveDegrees = i;
            break;
        case keys:
            res.keys.push_back(i);
            if ((int)res.keys.size() == res.count)
                state = trailing;
            break;
        case trailing:
            break;
        }
        if (!(state == keys || state == trailing))
            state = (parsePosition)(state + 1);
        if (state == keys && res.count == 0)
            state = trailing;
    }

    if (!(state == keys || state == trailing))
    {
        std::ostringstream oss;
        oss << "Incomplete KBM stream. Only able to read " << lineno << " lines. Read up to ";
        switch (state)
        {
        case map_size:
            oss << "map size.";
            break;
        case first_midi:
            oss << "first midi note.";
            break;
        case last_midi:
            oss << "last midi note.";
            break;
        case middle:
            oss << "scale zero note.";
            break;
        case reference:
            oss << "scale reference note.";
            break;
        case freq:
            oss << "scale reference frequency.";
            break;
        case degree:
            oss << "scale degree.";
            break;
        default:
            oss << "unknown state";
            break;
        }
        throw TuningError(oss.str());
    }

    if ((int)res.keys.size() != res.count)
    {
        throw TuningError("Different number of keys than mapping file indicates. Count is " +
                          std::to_string(res.count) + " and we parsed " +
                          std::to_string(res.keys.size()) + " keys.");
    }

    res.rawText = rawOSS.str();
    return res;
}